

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O0

void test_decimal128(void)

{
  byte bVar1;
  undefined8 uVar2;
  bson_decimal128_t *pbVar3;
  undefined8 uVar4;
  bson_t *bcon;
  bson_decimal128_t dec;
  bson_decimal128_t val;
  
  bson_decimal128_from_string("12",&bcon);
  uVar2 = bson_bcon_magic();
  pbVar3 = bcon_ensure_const_decimal128_ptr((bson_decimal128_t *)&bcon);
  uVar2 = bcon_new(0,"foo",uVar2,0x12,pbVar3);
  uVar4 = bson_bcone_magic();
  pbVar3 = bcon_ensure_const_decimal128_ptr((bson_decimal128_t *)&dec.high);
  bVar1 = bcon_extract(uVar2,"foo",uVar4,0x12,pbVar3,0);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x2c,"test_decimal128","BCON_EXTRACT (bcon, \"foo\", BCONE_DECIMAL128 (val))");
    abort();
  }
  if (dec.high != 0xc) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x2e,"test_decimal128","val.low == 0xCULL");
    abort();
  }
  if (val.low != 0x3040000000000000) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x2f,"test_decimal128","val.high == 0x3040000000000000ULL");
    abort();
  }
  bson_destroy(uVar2);
  return;
}

Assistant:

static void
test_decimal128 (void)
{
   bson_t bcon, expected;
   bson_decimal128_t dec;
   bson_decimal128_from_string ("120E20", &dec);

   bson_init (&bcon);
   bson_init (&expected);

   bson_append_decimal128 (&expected, "foo", -1, &dec);
   BCON_APPEND (&bcon, "foo", BCON_DECIMAL128 (&dec));

   bson_eq_bson (&bcon, &expected);

   bson_destroy (&bcon);
   bson_destroy (&expected);
}